

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

int evthread_is_debug_lock_held_(void *lock_)

{
  unsigned_long uVar1;
  unsigned_long me;
  debug_lock *lock;
  void *lock__local;
  
  if (*(int *)((long)lock_ + 0x10) == 0) {
    lock__local._4_4_ = 0;
  }
  else if ((evthread_id_fn_ == (_func_unsigned_long *)0x0) ||
          (uVar1 = (*evthread_id_fn_)(), *(unsigned_long *)((long)lock_ + 8) == uVar1)) {
    lock__local._4_4_ = 1;
  }
  else {
    lock__local._4_4_ = 0;
  }
  return lock__local._4_4_;
}

Assistant:

int
evthread_is_debug_lock_held_(void *lock_)
{
	struct debug_lock *lock = lock_;
	if (! lock->count)
		return 0;
	if (evthread_id_fn_) {
		unsigned long me = evthread_id_fn_();
		if (lock->held_by != me)
			return 0;
	}
	return 1;
}